

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O3

int uv_getaddrinfo(uv_loop_t *loop,uv_getaddrinfo_t *req,uv_getaddrinfo_cb cb,char *hostname,
                  char *service,addrinfo *hints)

{
  sockaddr *psVar1;
  addrinfo *paVar2;
  socklen_t sVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  addrinfo *paVar11;
  long lVar12;
  char *pcVar13;
  char hostname_ascii [256];
  char *local_160;
  size_t local_150;
  char local_138 [256];
  char local_38 [8];
  
  uVar9 = 0xffffffea;
  if (req == (uv_getaddrinfo_t *)0x0) {
    return -0x16;
  }
  if (hostname != (char *)0x0 || service != (char *)0x0) {
    if (hostname == (char *)0x0) {
      local_160 = (char *)0x0;
      local_150 = 0;
    }
    else {
      sVar10 = strlen(hostname);
      uVar9 = uv__idna_toascii(hostname,hostname + sVar10,local_138,local_38);
      if ((long)uVar9 < 0) goto LAB_00154b7f;
      local_160 = local_138;
      local_150 = strlen(local_160);
      local_150 = local_150 + 1;
    }
    if (service == (char *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen(service);
      sVar10 = sVar10 + 1;
    }
    lVar12 = 0x30;
    if (hints == (addrinfo *)0x0) {
      lVar12 = 0;
    }
    paVar11 = (addrinfo *)uv__malloc(lVar12 + local_150 + sVar10);
    if (paVar11 == (addrinfo *)0x0) {
      uVar9 = 0xfffffff4;
    }
    else {
      req->type = UV_GETADDRINFO;
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      req->loop = loop;
      req->cb = cb;
      req->hints = (addrinfo *)0x0;
      req->hostname = (char *)0x0;
      req->service = (char *)0x0;
      req->addrinfo = (addrinfo *)0x0;
      req->retcode = 0;
      if (hints == (addrinfo *)0x0) {
        lVar12 = 0;
      }
      else {
        iVar8 = hints->ai_flags;
        iVar5 = hints->ai_family;
        iVar6 = hints->ai_socktype;
        iVar7 = hints->ai_protocol;
        sVar3 = hints->ai_addrlen;
        uVar4 = *(undefined4 *)&hints->field_0x14;
        psVar1 = hints->ai_addr;
        paVar2 = hints->ai_next;
        paVar11->ai_canonname = hints->ai_canonname;
        paVar11->ai_next = paVar2;
        paVar11->ai_addrlen = sVar3;
        *(undefined4 *)&paVar11->field_0x14 = uVar4;
        paVar11->ai_addr = psVar1;
        paVar11->ai_flags = iVar8;
        paVar11->ai_family = iVar5;
        paVar11->ai_socktype = iVar6;
        paVar11->ai_protocol = iVar7;
        req->hints = paVar11;
        lVar12 = 0x30;
      }
      if (service != (char *)0x0) {
        pcVar13 = (char *)((long)&paVar11->ai_flags + lVar12);
        memcpy(pcVar13,service,sVar10);
        req->service = pcVar13;
        lVar12 = lVar12 + sVar10;
      }
      if (hostname != (char *)0x0) {
        pcVar13 = (char *)((long)&paVar11->ai_flags + lVar12);
        memcpy(pcVar13,local_160,local_150);
        req->hostname = pcVar13;
      }
      if (cb == (uv_getaddrinfo_cb)0x0) {
        iVar8 = getaddrinfo(req->hostname,req->service,(addrinfo *)req->hints,
                            (addrinfo **)&req->addrinfo);
        iVar8 = uv__getaddrinfo_translate_error(iVar8);
        req->retcode = iVar8;
        uv__getaddrinfo_done(&req->work_req,0);
        uVar9 = (ulong)(uint)req->retcode;
      }
      else {
        uv__work_submit(loop,&req->work_req,UV__WORK_SLOW_IO,uv__getaddrinfo_work,
                        uv__getaddrinfo_done);
        uVar9 = 0;
      }
    }
  }
LAB_00154b7f:
  return (int)uVar9;
}

Assistant:

int uv_getaddrinfo(uv_loop_t* loop,
                   uv_getaddrinfo_t* req,
                   uv_getaddrinfo_cb cb,
                   const char* hostname,
                   const char* service,
                   const struct addrinfo* hints) {
  char hostname_ascii[256];
  size_t hostname_len;
  size_t service_len;
  size_t hints_len;
  size_t len;
  char* buf;
  long rc;

  if (req == NULL || (hostname == NULL && service == NULL))
    return UV_EINVAL;

  /* FIXME(bnoordhuis) IDNA does not seem to work z/OS,
   * probably because it uses EBCDIC rather than ASCII.
   */
#ifdef __MVS__
  (void) &hostname_ascii;
#else
  if (hostname != NULL) {
    rc = uv__idna_toascii(hostname,
                          hostname + strlen(hostname),
                          hostname_ascii,
                          hostname_ascii + sizeof(hostname_ascii));
    if (rc < 0)
      return rc;
    hostname = hostname_ascii;
  }
#endif

  hostname_len = hostname ? strlen(hostname) + 1 : 0;
  service_len = service ? strlen(service) + 1 : 0;
  hints_len = hints ? sizeof(*hints) : 0;
  buf = uv__malloc(hostname_len + service_len + hints_len);

  if (buf == NULL)
    return UV_ENOMEM;

  uv__req_init(loop, req, UV_GETADDRINFO);
  req->loop = loop;
  req->cb = cb;
  req->addrinfo = NULL;
  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;
  req->retcode = 0;

  /* order matters, see uv_getaddrinfo_done() */
  len = 0;

  if (hints) {
    req->hints = memcpy(buf + len, hints, sizeof(*hints));
    len += sizeof(*hints);
  }

  if (service) {
    req->service = memcpy(buf + len, service, service_len);
    len += service_len;
  }

  if (hostname)
    req->hostname = memcpy(buf + len, hostname, hostname_len);

  if (cb) {
    uv__work_submit(loop,
                    &req->work_req,
                    UV__WORK_SLOW_IO,
                    uv__getaddrinfo_work,
                    uv__getaddrinfo_done);
    return 0;
  } else {
    uv__getaddrinfo_work(&req->work_req);
    uv__getaddrinfo_done(&req->work_req, 0);
    return req->retcode;
  }
}